

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O2

void __thiscall BinarySearchTree::caseB(BinarySearchTree *this,Node *par,Node *loc)

{
  Node *pNVar1;
  
  pNVar1 = loc->leftChild;
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = loc->rightChild;
  }
  if (par != (Node *)0x0) {
    this = (BinarySearchTree *)&par->rightChild;
    if (par->leftChild == loc) {
      this = (BinarySearchTree *)&par->leftChild;
    }
  }
  *this = (BinarySearchTree)pNVar1;
  return;
}

Assistant:

void BinarySearchTree::caseB(Node *par, Node *loc) {
    Node *child;
    if (loc->leftChild != nullptr) {
        child = loc->leftChild;
    } else {
        child = loc->rightChild;
    }
    if (par == nullptr) {
        root = child;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = child;
        } else {
            par->rightChild = child;
        }
    }
}